

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib_buffer_compressor_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::tools::
ZLIBBufferCompressorTest_reusing_the_same_compression_reduce_the_size_of_compression_when_compressing_the_same_input_Test
::TestBody(ZLIBBufferCompressorTest_reusing_the_same_compression_reduce_the_size_of_compression_when_compressing_the_same_input_Test
           *this)

{
  bool bVar1;
  ulong uVar2;
  pointer pcVar3;
  char *pcVar4;
  AssertHelper local_2e0;
  Message local_2d8;
  allocator local_2c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  undefined1 local_2a8 [8];
  AssertionResult gtest_ar_2;
  unique_ptr<const_char,_std::default_delete<const_char>_> decompressed_bytes2;
  ByteBuffer decompressed2;
  AssertHelper local_260;
  Message local_258;
  unsigned_long local_250;
  undefined1 local_248 [8];
  AssertionResult gtest_ar_1;
  size_t len2;
  ByteBuffer compressed2;
  AssertHelper local_1f8;
  Message local_1f0;
  allocator local_1e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar;
  unique_ptr<const_char,_std::default_delete<const_char>_> decompressed_bytes1;
  ByteBuffer decompressed1;
  ZLIBBufferInflator local_178 [8];
  ZLIBBufferInflator decompressor1;
  unsigned_long local_100;
  size_t len1;
  ByteBuffer compressed1;
  ZLIBBufferCompressor local_b8 [8];
  ZLIBBufferCompressor compressor1;
  ZLIBBufferCompressorTest_reusing_the_same_compression_reduce_the_size_of_compression_when_compressing_the_same_input_Test
  *this_local;
  
  bidfx_public_api::tools::ZLIBBufferCompressor::ZLIBBufferCompressor(local_b8,5);
  uVar2 = std::__cxx11::string::operator[]
                    ((ulong)&(this->super_ZLIBBufferCompressorTest).BIGGER_TEXT);
  std::__cxx11::string::size();
  bidfx_public_api::tools::ZLIBBufferCompressor::Compress((uchar *)local_b8,uVar2,0);
  bidfx_public_api::tools::ZLIBBufferCompressor::GetCompressed();
  local_100 = bidfx_public_api::tools::ByteBuffer::ReadableBytes();
  bidfx_public_api::tools::ZLIBBufferInflator::ZLIBBufferInflator(local_178);
  bidfx_public_api::tools::ZLIBBufferInflator::Inflate((ByteBuffer *)&decompressed_bytes1);
  pcVar3 = (pointer)bidfx_public_api::tools::ByteBuffer::ToArray();
  std::unique_ptr<char_const,std::default_delete<char_const>>::
  unique_ptr<std::default_delete<char_const>,void>
            ((unique_ptr<char_const,std::default_delete<char_const>> *)&gtest_ar.message_,pcVar3);
  pcVar3 = std::unique_ptr<const_char,_std::default_delete<const_char>_>::get
                     ((unique_ptr<const_char,_std::default_delete<const_char>_> *)&gtest_ar.message_
                     );
  uVar2 = bidfx_public_api::tools::ByteBuffer::ReadableBytes();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1e0,pcVar3,uVar2,&local_1e1);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_1c0,"BIGGER_TEXT",
             "std::string(decompressed_bytes1.get(), decompressed1.ReadableBytes())",
             &(this->super_ZLIBBufferCompressorTest).BIGGER_TEXT,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
  if (!bVar1) {
    testing::Message::Message(&local_1f0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1c0);
    testing::internal::AssertHelper::AssertHelper
              (&local_1f8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/zlib_buffer_compressor_test.cpp"
               ,0x133,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1f8,&local_1f0);
    testing::internal::AssertHelper::~AssertHelper(&local_1f8);
    testing::Message::~Message(&local_1f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
  if (bVar1) {
    uVar2 = std::__cxx11::string::operator[]
                      ((ulong)&(this->super_ZLIBBufferCompressorTest).BIGGER_TEXT);
    std::__cxx11::string::size();
    bidfx_public_api::tools::ZLIBBufferCompressor::Compress((uchar *)local_b8,uVar2,0);
    bidfx_public_api::tools::ZLIBBufferCompressor::GetCompressed();
    gtest_ar_1.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         bidfx_public_api::tools::ByteBuffer::ReadableBytes();
    local_250 = (long)gtest_ar_1.message_.ptr_ * 10;
    testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
              ((internal *)local_248,"len2 * 10","len1",&local_250,&local_100);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_248);
    if (!bVar1) {
      testing::Message::Message(&local_258);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_248);
      testing::internal::AssertHelper::AssertHelper
                (&local_260,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/zlib_buffer_compressor_test.cpp"
                 ,0x138,pcVar4);
      testing::internal::AssertHelper::operator=(&local_260,&local_258);
      testing::internal::AssertHelper::~AssertHelper(&local_260);
      testing::Message::~Message(&local_258);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_248);
    bidfx_public_api::tools::ZLIBBufferInflator::Inflate((ByteBuffer *)&decompressed_bytes2);
    pcVar3 = (pointer)bidfx_public_api::tools::ByteBuffer::ToArray();
    std::unique_ptr<char_const,std::default_delete<char_const>>::
    unique_ptr<std::default_delete<char_const>,void>
              ((unique_ptr<char_const,std::default_delete<char_const>> *)&gtest_ar_2.message_,pcVar3
              );
    pcVar3 = std::unique_ptr<const_char,_std::default_delete<const_char>_>::get
                       ((unique_ptr<const_char,_std::default_delete<const_char>_> *)
                        &gtest_ar_2.message_);
    uVar2 = bidfx_public_api::tools::ByteBuffer::ReadableBytes();
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2c8,pcVar3,uVar2,&local_2c9);
    testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
              ((EqHelper<false> *)local_2a8,"BIGGER_TEXT",
               "std::string(decompressed_bytes2.get(), decompressed2.ReadableBytes())",
               &(this->super_ZLIBBufferCompressorTest).BIGGER_TEXT,&local_2c8);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a8);
    if (!bVar1) {
      testing::Message::Message(&local_2d8);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2a8);
      testing::internal::AssertHelper::AssertHelper
                (&local_2e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/zlib_buffer_compressor_test.cpp"
                 ,0x13c,pcVar4);
      testing::internal::AssertHelper::operator=(&local_2e0,&local_2d8);
      testing::internal::AssertHelper::~AssertHelper(&local_2e0);
      testing::Message::~Message(&local_2d8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a8);
    std::unique_ptr<const_char,_std::default_delete<const_char>_>::~unique_ptr
              ((unique_ptr<const_char,_std::default_delete<const_char>_> *)&gtest_ar_2.message_);
    bidfx_public_api::tools::ByteBuffer::~ByteBuffer((ByteBuffer *)&decompressed_bytes2);
    bidfx_public_api::tools::ByteBuffer::~ByteBuffer((ByteBuffer *)&len2);
  }
  std::unique_ptr<const_char,_std::default_delete<const_char>_>::~unique_ptr
            ((unique_ptr<const_char,_std::default_delete<const_char>_> *)&gtest_ar.message_);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer((ByteBuffer *)&decompressed_bytes1);
  bidfx_public_api::tools::ZLIBBufferInflator::~ZLIBBufferInflator(local_178);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer((ByteBuffer *)&len1);
  bidfx_public_api::tools::ZLIBBufferCompressor::~ZLIBBufferCompressor(local_b8);
  return;
}

Assistant:

TEST_F(ZLIBBufferCompressorTest, reusing_the_same_compression_reduce_the_size_of_compression_when_compressing_the_same_input)
{
    ZLIBBufferCompressor compressor1 = ZLIBBufferCompressor(5);
    compressor1.Compress((unsigned char*) &BIGGER_TEXT[0], 0, BIGGER_TEXT.size());
    ByteBuffer compressed1 = compressor1.GetCompressed();
    size_t len1 = compressed1.ReadableBytes();

    ZLIBBufferInflator decompressor1;
    ByteBuffer decompressed1 = decompressor1.Inflate(compressed1);
    std::unique_ptr<const char> decompressed_bytes1 = std::unique_ptr<const char>((const char*) decompressed1.ToArray());
    ASSERT_EQ(BIGGER_TEXT, std::string(decompressed_bytes1.get(), decompressed1.ReadableBytes()));

    compressor1.Compress((unsigned char*) &BIGGER_TEXT[0], 0, BIGGER_TEXT.size());
    ByteBuffer compressed2 = compressor1.GetCompressed();
    size_t len2 = compressed2.ReadableBytes();
    EXPECT_LT(len2 * 10, len1);

    ByteBuffer decompressed2 = decompressor1.Inflate(compressed2);
    std::unique_ptr<const char> decompressed_bytes2 = std::unique_ptr<const char>((const char*) decompressed2.ToArray());
    EXPECT_EQ(BIGGER_TEXT, std::string(decompressed_bytes2.get(), decompressed2.ReadableBytes()));
}